

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O1

int abuf_puts(autobuf *autobuf,char *s)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = 0;
  if (s != (char *)0x0 && autobuf != (autobuf *)0x0) {
    sVar2 = strlen(s);
    iVar1 = _autobuf_enlarge(autobuf,sVar2 + autobuf->_len + 1);
    if (iVar1 < 0) {
      sVar2 = 0xffffffff;
    }
    else {
      strcpy(autobuf->_buf + autobuf->_len,s);
      autobuf->_len = autobuf->_len + sVar2;
    }
  }
  return (int)sVar2;
}

Assistant:

int
abuf_puts(struct autobuf *autobuf, const char *s) {
  size_t len;

  if (autobuf == NULL || s == NULL)
    return 0;

  len = strlen(s);
  if (_autobuf_enlarge(autobuf, autobuf->_len + len + 1) < 0) {
    return -1;
  }
  strcpy(autobuf->_buf + autobuf->_len, s);
  autobuf->_len += len;
  return len;
}